

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Exception.h
# Opt level: O2

void __thiscall
luna::Exception::SetWhat<char_const*&,char,int&,char,char_const*&>
          (Exception *this,ostringstream *oss,char **arg,char *args,int *args_1,char *args_2,
          char **args_3)

{
  std::operator<<((ostream *)oss,*arg);
  SetWhat<char,int&,char,char_const*&>(this,oss,args,args_1,args_2,args_3);
  return;
}

Assistant:

void SetWhat(std::ostringstream &oss, Arg&& arg, Args&&... args)
        {
            oss << std::forward<Arg>(arg);
            SetWhat(oss, std::forward<Args>(args)...);
        }